

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantNet::get_conv_names(QuantNet *this)

{
  string *__lhs;
  pointer ppLVar1;
  Layer *pLVar2;
  bool bVar3;
  ulong uVar4;
  string name;
  value_type local_50;
  
  uVar4 = 0;
  do {
    ppLVar1 = (this->super_Net).layers.
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar4) {
      return 0;
    }
    pLVar2 = ppLVar1[uVar4];
    __lhs = &pLVar2->type;
    bVar3 = std::operator==(__lhs,"Convolution");
    if (bVar3) {
LAB_00112926:
      std::__cxx11::string::string((string *)&local_50,(string *)&pLVar2->name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->conv_names,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar3 = std::operator==(__lhs,"ConvolutionDepthWise");
      if (bVar3) goto LAB_00112926;
      bVar3 = std::operator==(__lhs,"InnerProduct");
      if (bVar3) goto LAB_00112926;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int QuantNet::get_conv_names()
{
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            std::string name = layer->name;
            conv_names.push_back(name);
        }
    }        

    return 0;
}